

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpre.c
# Opt level: O1

ssize_t mpt_qpre(mpt_queue *queue,size_t len)

{
  ulong uVar1;
  size_t sVar2;
  size_t high;
  size_t low;
  ulong local_30;
  size_t local_28;
  
  mpt_queue_empty(queue,&local_28,&local_30);
  uVar1 = 0xffffffffffffffef;
  if (len <= local_28 + local_30) {
    if (local_30 < len && local_30 != 0) {
      queue->off = (local_30 - len) + queue->max;
    }
    else {
      sVar2 = queue->off - len;
      if (queue->off < len || sVar2 == 0) {
        sVar2 = sVar2 + queue->max;
      }
      queue->off = sVar2;
    }
    queue->len = queue->len + len;
    uVar1 = ((local_28 + local_30) - len) / len;
  }
  return uVar1;
}

Assistant:

extern ssize_t mpt_qpre(MPT_STRUCT(queue) *queue, size_t len)
{
	size_t low, high, total;
	
	mpt_queue_empty(queue, &low, &high);
	total = low + high;
	
	/* not enough remaining space */
	if (len > total) {
		return MPT_ERROR(MissingBuffer);
	}
	/* data element wraps around upper border */
	if (high && high < len) {
		queue->off = queue->max - (len - high);
	}
	else {
		if (len < queue->off) queue->off -= len;
		else queue->off += queue->max - len;
	}
	total -= len;
	queue->len += len;
	
	return total / len;
}